

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O3

Error __thiscall asmjit::CodeBuilder::getCBLabel(CodeBuilder *this,CBLabel **pOut,uint32_t id)

{
  ZoneVector<asmjit::CBLabel_*> *this_00;
  CodeHolder *pCVar1;
  Error EVar2;
  ulong uVar3;
  CBLabel *pCVar4;
  ulong uVar5;
  size_t local_30;
  
  EVar2 = (this->super_CodeEmitter)._lastError;
  if (EVar2 != 0) {
    return EVar2;
  }
  pCVar1 = (this->super_CodeEmitter)._code;
  if (pCVar1 == (CodeHolder *)0x0) {
    getCBLabel();
    return 0xc;
  }
  uVar5 = (ulong)(id - 0x100);
  if ((pCVar1->_labels).super_ZoneVectorBase._length <= uVar5) {
    return 0xc;
  }
  uVar3 = (this->_cbLabels).super_ZoneVectorBase._length;
  this_00 = &this->_cbLabels;
  if (uVar3 <= uVar5) {
    EVar2 = ZoneVectorBase::_resize(&this_00->super_ZoneVectorBase,&this->_cbHeap,8,uVar5 + 1);
    if (EVar2 != 0) {
      return EVar2;
    }
    uVar3 = (this->_cbLabels).super_ZoneVectorBase._length;
  }
  if (uVar5 < uVar3) {
    pCVar4 = *(CBLabel **)((long)(this_00->super_ZoneVectorBase)._data + uVar5 * 8);
    if (pCVar4 != (CBLabel *)0x0) {
LAB_00161d1d:
      *pOut = pCVar4;
      return 0;
    }
    if ((this->_cbHeap)._zone != (Zone *)0x0) {
      pCVar4 = (CBLabel *)ZoneHeap::_alloc(&this->_cbHeap,0x38,&local_30);
      (pCVar4->super_CBNode)._prev = (CBNode *)0x0;
      (pCVar4->super_CBNode)._next = (CBNode *)0x0;
      (pCVar4->super_CBNode)._type = '\x04';
      (pCVar4->super_CBNode)._opCount = '\0';
      (pCVar4->super_CBNode)._flags = (uint16_t)this->_nodeFlags;
      (pCVar4->super_CBNode)._position = this->_position;
      (pCVar4->super_CBNode)._inlineComment = (char *)0x0;
      (pCVar4->super_CBNode)._passData = (void *)0x0;
      pCVar4->_id = id;
      pCVar4->_numRefs = 0;
      pCVar4->_from = (CBJump *)0x0;
      if (uVar5 < (this->_cbLabels).super_ZoneVectorBase._length) {
        *(CBLabel **)((long)(this_00->super_ZoneVectorBase)._data + uVar5 * 8) = pCVar4;
        goto LAB_00161d1d;
      }
      goto LAB_00161d46;
    }
  }
  else {
    getCBLabel();
  }
  getCBLabel();
LAB_00161d46:
  getCBLabel();
}

Assistant:

Error CodeBuilder::getCBLabel(CBLabel** pOut, uint32_t id) noexcept {
  if (_lastError) return _lastError;
  ASMJIT_ASSERT(_code != nullptr);

  size_t index = Operand::unpackId(id);
  if (ASMJIT_UNLIKELY(index >= _code->getLabelsCount()))
    return DebugUtils::errored(kErrorInvalidLabel);

  if (index >= _cbLabels.getLength())
    ASMJIT_PROPAGATE(_cbLabels.resize(&_cbHeap, index + 1));

  CBLabel* node = _cbLabels[index];
  if (!node) {
    node = newNodeT<CBLabel>(id);
    if (ASMJIT_UNLIKELY(!node))
      return DebugUtils::errored(kErrorNoHeapMemory);
    _cbLabels[index] = node;
  }

  *pOut = node;
  return kErrorOk;
}